

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

bool __thiscall QAccessibleTabButton::isValid(QAccessibleTabButton *this)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  
  pDVar1 = (this->m_parent).wp.d;
  if (pDVar1 != (Data *)0x0) {
    bVar2 = false;
    if ((*(int *)(pDVar1 + 4) != 0) && (bVar2 = false, (this->m_parent).wp.value != (QObject *)0x0))
    {
      if ((*(byte *)(*(long *)((this->m_parent).wp.value + 8) + 0x1c2) & 4) == 0) {
        iVar3 = QTabBar::count((QTabBar *)(this->m_parent).wp.value);
        bVar2 = this->m_index < iVar3;
      }
      else {
        bVar2 = false;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }